

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O1

bool __thiscall
google::protobuf::internal::ExtensionSet::ParseFieldWithExtensionInfo
          (ExtensionSet *this,int number,bool was_packed_on_wire,ExtensionInfo *extension,
          CodedInputStream *input,FieldSkipper *field_skipper)

{
  byte bVar1;
  uint8_t uVar2;
  byte *pbVar3;
  uint8_t *puVar4;
  double *pdVar5;
  ulong uVar6;
  bool bVar7;
  int iVar8;
  uint32_t uVar9;
  MessageLite *pMVar10;
  string *value_00;
  pair<int,_int> pVar11;
  int64_t iVar12;
  LogMessage *other;
  FieldDescriptor *pFVar13;
  FieldType FVar14;
  undefined7 in_register_00000011;
  int value;
  ulong unaff_RBP;
  uint uVar15;
  unsigned_long uVar16;
  uint64_t uVar17;
  ulong uVar18;
  bool bVar19;
  pair<unsigned_long,_bool> pVar20;
  pair<unsigned_long,_bool> pVar21;
  pair<unsigned_long,_bool> pVar22;
  pair<unsigned_long,_bool> pVar23;
  uint64_t value_1;
  LogFinisher local_79;
  LogMessage local_78;
  Limit local_3c;
  ExtensionSet *local_38;
  
  if ((int)CONCAT71(in_register_00000011,was_packed_on_wire) != 0) {
    pbVar3 = input->buffer_;
    if (pbVar3 < input->buffer_end_) {
      uVar15 = (uint)*pbVar3;
      if (-1 < (char)*pbVar3) {
        input->buffer_ = pbVar3 + 1;
        bVar19 = true;
        goto LAB_003da34f;
      }
    }
    else {
      uVar15 = 0;
    }
    iVar12 = io::CodedInputStream::ReadVarint32Fallback(input,uVar15);
    uVar15 = (uint)iVar12;
    bVar19 = -1 < iVar12;
LAB_003da34f:
    if (!bVar19) {
      return false;
    }
    local_3c = io::CodedInputStream::PushLimit(input,uVar15);
    switch(extension->type) {
    case '\x01':
      iVar8 = io::CodedInputStream::BytesUntilLimit(input);
      if (0 < iVar8) {
        do {
          pdVar5 = (double *)input->buffer_;
          if (*(int *)&input->buffer_end_ - (int)pdVar5 < 8) {
            bVar19 = io::CodedInputStream::ReadLittleEndian64Fallback(input,(uint64_t *)&local_78);
          }
          else {
            local_78._0_8_ = *pdVar5;
            input->buffer_ = (uint8_t *)(pdVar5 + 1);
            bVar19 = true;
          }
          if (bVar19 == false) {
            return false;
          }
          AddDouble(this,number,'\x01',extension->is_packed,(double)local_78._0_8_,
                    extension->descriptor);
          iVar8 = io::CodedInputStream::BytesUntilLimit(input);
        } while (0 < iVar8);
      }
      break;
    case '\x02':
      iVar8 = io::CodedInputStream::BytesUntilLimit(input);
      if (0 < iVar8) {
        do {
          puVar4 = input->buffer_;
          if (*(int *)&input->buffer_end_ - (int)puVar4 < 4) {
            bVar19 = io::CodedInputStream::ReadLittleEndian32Fallback(input,&local_78.level_);
          }
          else {
            local_78.level_ = *(undefined4 *)puVar4;
            input->buffer_ = puVar4 + 4;
            bVar19 = true;
          }
          if (bVar19 == false) {
            return false;
          }
          AddFloat(this,number,'\x02',extension->is_packed,(float)local_78.level_,
                   extension->descriptor);
          iVar8 = io::CodedInputStream::BytesUntilLimit(input);
        } while (0 < iVar8);
      }
      break;
    case '\x03':
      while (iVar8 = io::CodedInputStream::BytesUntilLimit(input), 0 < iVar8) {
        puVar4 = input->buffer_;
        if ((puVar4 < input->buffer_end_) &&
           (uVar16 = (unsigned_long)(char)*puVar4, -1 < (long)uVar16)) {
          input->buffer_ = puVar4 + 1;
          pVar20._8_8_ = 1;
          pVar20.first = (unsigned_long)(puVar4 + 1);
        }
        else {
          pVar20 = io::CodedInputStream::ReadVarint64Fallback(input);
          uVar16 = pVar20.first;
        }
        if (((undefined1  [16])pVar20 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
          return false;
        }
        AddInt64(this,number,'\x03',extension->is_packed,uVar16,extension->descriptor);
      }
      break;
    case '\x04':
      while (iVar8 = io::CodedInputStream::BytesUntilLimit(input), 0 < iVar8) {
        puVar4 = input->buffer_;
        if ((puVar4 < input->buffer_end_) && (uVar17 = (uint64_t)(char)*puVar4, -1 < (long)uVar17))
        {
          input->buffer_ = puVar4 + 1;
          pVar21._8_8_ = 1;
          pVar21.first = (unsigned_long)(puVar4 + 1);
        }
        else {
          pVar21 = io::CodedInputStream::ReadVarint64Fallback(input);
          uVar17 = pVar21.first;
        }
        if (((undefined1  [16])pVar21 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
          return false;
        }
        AddUInt64(this,number,'\x04',extension->is_packed,uVar17,extension->descriptor);
      }
      break;
    case '\x05':
      while (iVar8 = io::CodedInputStream::BytesUntilLimit(input), 0 < iVar8) {
        pbVar3 = input->buffer_;
        if (pbVar3 < input->buffer_end_) {
          bVar1 = *pbVar3;
          uVar18 = (ulong)bVar1;
          uVar9 = (uint32_t)bVar1;
          if ((char)bVar1 < '\0') goto LAB_003da46e;
          input->buffer_ = pbVar3 + 1;
          bVar19 = true;
        }
        else {
          uVar9 = 0;
LAB_003da46e:
          uVar18 = io::CodedInputStream::ReadVarint32Fallback(input,uVar9);
          bVar19 = -1 < (long)uVar18;
        }
        if (!bVar19) {
          return false;
        }
        AddInt32(this,number,'\x05',extension->is_packed,(int32_t)uVar18,extension->descriptor);
      }
      break;
    case '\x06':
      iVar8 = io::CodedInputStream::BytesUntilLimit(input);
      if (0 < iVar8) {
        do {
          pdVar5 = (double *)input->buffer_;
          if (*(int *)&input->buffer_end_ - (int)pdVar5 < 8) {
            bVar19 = io::CodedInputStream::ReadLittleEndian64Fallback(input,(uint64_t *)&local_78);
            if (!bVar19) {
              return false;
            }
          }
          else {
            local_78._0_8_ = *pdVar5;
            input->buffer_ = (uint8_t *)(pdVar5 + 1);
          }
          AddUInt64(this,number,'\x06',extension->is_packed,local_78._0_8_,extension->descriptor);
          iVar8 = io::CodedInputStream::BytesUntilLimit(input);
        } while (0 < iVar8);
      }
      break;
    case '\a':
      iVar8 = io::CodedInputStream::BytesUntilLimit(input);
      if (0 < iVar8) {
        do {
          puVar4 = input->buffer_;
          if (*(int *)&input->buffer_end_ - (int)puVar4 < 4) {
            bVar19 = io::CodedInputStream::ReadLittleEndian32Fallback(input,&local_78.level_);
            if (!bVar19) {
              return false;
            }
          }
          else {
            local_78.level_ = *(undefined4 *)puVar4;
            input->buffer_ = puVar4 + 4;
          }
          AddUInt32(this,number,'\a',extension->is_packed,local_78.level_,extension->descriptor);
          iVar8 = io::CodedInputStream::BytesUntilLimit(input);
        } while (0 < iVar8);
      }
      break;
    case '\b':
      while (iVar8 = io::CodedInputStream::BytesUntilLimit(input), 0 < iVar8) {
        puVar4 = input->buffer_;
        if ((puVar4 < input->buffer_end_) && (uVar2 = *puVar4, -1 < (long)(char)uVar2)) {
          input->buffer_ = puVar4 + 1;
          pVar22._8_8_ = 1;
          pVar22.first = (long)(char)uVar2;
        }
        else {
          pVar22 = io::CodedInputStream::ReadVarint64Fallback(input);
        }
        if (((undefined1  [16])pVar22 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
          return false;
        }
        AddBool(this,number,'\b',extension->is_packed,pVar22.first != 0,extension->descriptor);
      }
      break;
    case '\t':
    case '\n':
    case '\v':
    case '\f':
      LogMessage::LogMessage
                (&local_78,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
                 ,0x55c);
      other = LogMessage::operator<<(&local_78,"Non-primitive types can\'t be packed.");
      LogFinisher::operator=(&local_79,other);
      LogMessage::~LogMessage(&local_78);
      break;
    case '\r':
      while (iVar8 = io::CodedInputStream::BytesUntilLimit(input), 0 < iVar8) {
        pbVar3 = input->buffer_;
        if (pbVar3 < input->buffer_end_) {
          bVar1 = *pbVar3;
          uVar18 = (ulong)bVar1;
          uVar9 = (uint32_t)bVar1;
          if ((char)bVar1 < '\0') goto LAB_003da4d5;
          input->buffer_ = pbVar3 + 1;
          bVar19 = true;
        }
        else {
          uVar9 = 0;
LAB_003da4d5:
          uVar18 = io::CodedInputStream::ReadVarint32Fallback(input,uVar9);
          bVar19 = -1 < (long)uVar18;
        }
        if (!bVar19) {
          return false;
        }
        AddUInt32(this,number,'\r',extension->is_packed,(uint32_t)uVar18,extension->descriptor);
      }
      break;
    case '\x0e':
      local_38 = this;
      while (iVar8 = io::CodedInputStream::BytesUntilLimit(input), 0 < iVar8) {
        pbVar3 = input->buffer_;
        if (pbVar3 < input->buffer_end_) {
          bVar1 = *pbVar3;
          uVar18 = (ulong)bVar1;
          uVar9 = (uint32_t)bVar1;
          if ((char)bVar1 < '\0') goto LAB_003da8c1;
          input->buffer_ = pbVar3 + 1;
          bVar19 = true;
        }
        else {
          uVar9 = 0;
LAB_003da8c1:
          uVar18 = io::CodedInputStream::ReadVarint32Fallback(input,uVar9);
          bVar19 = -1 < (long)uVar18;
        }
        uVar6 = unaff_RBP;
        if (bVar19) {
          uVar6 = uVar18;
        }
        unaff_RBP = uVar6 & 0xffffffff;
        if (!bVar19) {
          return false;
        }
        bVar7 = (*(extension->field_5).enum_validity_check.func)
                          ((extension->field_5).enum_validity_check.arg,(int)uVar6);
        if (bVar7) {
          AddEnum(local_38,number,'\x0e',extension->is_packed,(int)uVar6,extension->descriptor);
        }
        else {
          (*field_skipper->_vptr_FieldSkipper[4])(field_skipper,number,uVar6 & 0xffffffff);
        }
        if (!bVar19) {
          return false;
        }
      }
      break;
    case '\x0f':
      iVar8 = io::CodedInputStream::BytesUntilLimit(input);
      if (0 < iVar8) {
        do {
          puVar4 = input->buffer_;
          if (*(int *)&input->buffer_end_ - (int)puVar4 < 4) {
            bVar19 = io::CodedInputStream::ReadLittleEndian32Fallback(input,&local_78.level_);
          }
          else {
            local_78.level_ = *(undefined4 *)puVar4;
            input->buffer_ = puVar4 + 4;
            bVar19 = true;
          }
          if (bVar19 == false) {
            return false;
          }
          AddInt32(this,number,'\x0f',extension->is_packed,local_78.level_,extension->descriptor);
          iVar8 = io::CodedInputStream::BytesUntilLimit(input);
        } while (0 < iVar8);
      }
      break;
    case '\x10':
      iVar8 = io::CodedInputStream::BytesUntilLimit(input);
      if (0 < iVar8) {
        do {
          pdVar5 = (double *)input->buffer_;
          if (*(int *)&input->buffer_end_ - (int)pdVar5 < 8) {
            bVar19 = io::CodedInputStream::ReadLittleEndian64Fallback(input,(uint64_t *)&local_78);
          }
          else {
            local_78._0_8_ = *pdVar5;
            input->buffer_ = (uint8_t *)(pdVar5 + 1);
            bVar19 = true;
          }
          if (bVar19 == false) {
            return false;
          }
          AddInt64(this,number,'\x10',extension->is_packed,local_78._0_8_,extension->descriptor);
          iVar8 = io::CodedInputStream::BytesUntilLimit(input);
        } while (0 < iVar8);
      }
      break;
    case '\x11':
      while (iVar8 = io::CodedInputStream::BytesUntilLimit(input), 0 < iVar8) {
        pbVar3 = input->buffer_;
        if (pbVar3 < input->buffer_end_) {
          bVar1 = *pbVar3;
          uVar18 = (ulong)bVar1;
          uVar9 = (uint32_t)bVar1;
          if ((char)bVar1 < '\0') goto LAB_003da3f8;
          input->buffer_ = pbVar3 + 1;
          bVar19 = true;
        }
        else {
          uVar9 = 0;
LAB_003da3f8:
          uVar18 = io::CodedInputStream::ReadVarint32Fallback(input,uVar9);
          bVar19 = -1 < (long)uVar18;
        }
        if (!bVar19) {
          return false;
        }
        AddInt32(this,number,'\x11',extension->is_packed,
                 -((uint)uVar18 & 1) ^ (uint)(uVar18 >> 1) & 0x7fffffff,extension->descriptor);
      }
      break;
    case '\x12':
      while (iVar8 = io::CodedInputStream::BytesUntilLimit(input), 0 < iVar8) {
        puVar4 = input->buffer_;
        if ((puVar4 < input->buffer_end_) && (uVar18 = (ulong)(char)*puVar4, -1 < (long)uVar18)) {
          input->buffer_ = puVar4 + 1;
          pVar23._8_8_ = 1;
          pVar23.first = (unsigned_long)(puVar4 + 1);
        }
        else {
          pVar23 = io::CodedInputStream::ReadVarint64Fallback(input);
          uVar18 = pVar23.first;
        }
        if (((undefined1  [16])pVar23 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
          return false;
        }
        AddInt64(this,number,'\x12',extension->is_packed,-(ulong)((uint)uVar18 & 1) ^ uVar18 >> 1,
                 extension->descriptor);
      }
    }
    io::CodedInputStream::PopLimit(input,local_3c);
    return true;
  }
  switch(extension->type) {
  case '\x01':
    pdVar5 = (double *)input->buffer_;
    if (*(int *)&input->buffer_end_ - (int)pdVar5 < 8) {
      bVar19 = io::CodedInputStream::ReadLittleEndian64Fallback(input,(uint64_t *)&local_78);
    }
    else {
      local_78._0_8_ = *pdVar5;
      input->buffer_ = (uint8_t *)(pdVar5 + 1);
      bVar19 = true;
    }
    if (bVar19 == false) {
      return false;
    }
    if (extension->is_repeated == true) {
      AddDouble(this,number,'\x01',extension->is_packed,(double)local_78._0_8_,extension->descriptor
               );
    }
    else {
      SetDouble(this,number,'\x01',(double)local_78._0_8_,extension->descriptor);
    }
    break;
  case '\x02':
    puVar4 = input->buffer_;
    if (*(int *)&input->buffer_end_ - (int)puVar4 < 4) {
      bVar19 = io::CodedInputStream::ReadLittleEndian32Fallback(input,&local_78.level_);
    }
    else {
      local_78.level_ = *(undefined4 *)puVar4;
      input->buffer_ = puVar4 + 4;
      bVar19 = true;
    }
    if (bVar19 == false) {
      return false;
    }
    if (extension->is_repeated == true) {
      AddFloat(this,number,'\x02',extension->is_packed,(float)local_78.level_,extension->descriptor)
      ;
    }
    else {
      SetFloat(this,number,'\x02',(float)local_78.level_,extension->descriptor);
    }
    break;
  case '\x03':
    puVar4 = input->buffer_;
    if ((puVar4 < input->buffer_end_) && (uVar18 = (ulong)(char)*puVar4, -1 < (long)uVar18)) {
      input->buffer_ = puVar4 + 1;
      uVar15 = 1;
    }
    else {
      pVar23 = io::CodedInputStream::ReadVarint64Fallback(input);
      uVar18 = pVar23.first;
      uVar15 = pVar23._8_4_;
    }
    if ((uVar15 & 1) == 0) {
      return false;
    }
    if (extension->is_repeated == true) {
      bVar19 = extension->is_packed;
      pFVar13 = extension->descriptor;
      FVar14 = '\x03';
LAB_003da1db:
      AddInt64(this,number,FVar14,bVar19,uVar18,pFVar13);
      goto LAB_003da2ee;
    }
    pFVar13 = extension->descriptor;
    FVar14 = '\x03';
    goto LAB_003da2e6;
  case '\x04':
    puVar4 = input->buffer_;
    if ((puVar4 < input->buffer_end_) && (uVar17 = (uint64_t)(char)*puVar4, -1 < (long)uVar17)) {
      input->buffer_ = puVar4 + 1;
      uVar15 = 1;
    }
    else {
      pVar23 = io::CodedInputStream::ReadVarint64Fallback(input);
      uVar17 = pVar23.first;
      uVar15 = pVar23._8_4_;
    }
    if ((uVar15 & 1) == 0) {
      return false;
    }
    if (extension->is_repeated == true) {
      AddUInt64(this,number,'\x04',extension->is_packed,uVar17,extension->descriptor);
    }
    else {
      SetUInt64(this,number,'\x04',uVar17,extension->descriptor);
    }
    goto LAB_003da2ee;
  case '\x05':
    pbVar3 = input->buffer_;
    if (pbVar3 < input->buffer_end_) {
      bVar1 = *pbVar3;
      uVar18 = (ulong)bVar1;
      uVar9 = (uint32_t)bVar1;
      if ((char)bVar1 < '\0') goto LAB_003daa8c;
      input->buffer_ = pbVar3 + 1;
      bVar19 = true;
    }
    else {
      uVar9 = 0;
LAB_003daa8c:
      uVar18 = io::CodedInputStream::ReadVarint32Fallback(input,uVar9);
      bVar19 = -1 < (long)uVar18;
    }
    uVar15 = (uint)uVar18;
    if (!bVar19) {
      return false;
    }
    if (extension->is_repeated == true) {
      bVar7 = extension->is_packed;
      pFVar13 = extension->descriptor;
      FVar14 = '\x05';
LAB_003daabf:
      AddInt32(this,number,FVar14,bVar7,uVar15,pFVar13);
      goto LAB_003dab3c;
    }
    pFVar13 = extension->descriptor;
    FVar14 = '\x05';
    goto LAB_003daad8;
  case '\x06':
    pdVar5 = (double *)input->buffer_;
    if (*(int *)&input->buffer_end_ - (int)pdVar5 < 8) {
      bVar19 = io::CodedInputStream::ReadLittleEndian64Fallback(input,(uint64_t *)&local_78);
    }
    else {
      local_78._0_8_ = *pdVar5;
      input->buffer_ = (uint8_t *)(pdVar5 + 1);
      bVar19 = true;
    }
    if (bVar19 == false) {
      return false;
    }
    if (extension->is_repeated == true) {
      AddUInt64(this,number,'\x06',extension->is_packed,local_78._0_8_,extension->descriptor);
    }
    else {
      SetUInt64(this,number,'\x06',local_78._0_8_,extension->descriptor);
    }
    break;
  case '\a':
    puVar4 = input->buffer_;
    if (*(int *)&input->buffer_end_ - (int)puVar4 < 4) {
      bVar19 = io::CodedInputStream::ReadLittleEndian32Fallback(input,&local_78.level_);
    }
    else {
      local_78.level_ = *(undefined4 *)puVar4;
      input->buffer_ = puVar4 + 4;
      bVar19 = true;
    }
    if (bVar19 == false) {
      return false;
    }
    if (extension->is_repeated == true) {
      AddUInt32(this,number,'\a',extension->is_packed,local_78.level_,extension->descriptor);
    }
    else {
      SetUInt32(this,number,'\a',local_78.level_,extension->descriptor);
    }
    break;
  case '\b':
    puVar4 = input->buffer_;
    if ((puVar4 < input->buffer_end_) && (uVar16 = (unsigned_long)(char)*puVar4, -1 < (long)uVar16))
    {
      input->buffer_ = puVar4 + 1;
      uVar15 = 1;
    }
    else {
      pVar23 = io::CodedInputStream::ReadVarint64Fallback(input);
      uVar16 = pVar23.first;
      uVar15 = pVar23._8_4_;
    }
    if ((uVar15 & 1) == 0) {
      return false;
    }
    if (extension->is_repeated == true) {
      AddBool(this,number,'\b',extension->is_packed,uVar16 != 0,extension->descriptor);
    }
    else {
      SetBool(this,number,'\b',uVar16 != 0,extension->descriptor);
    }
    goto LAB_003da2ee;
  case '\t':
    pFVar13 = extension->descriptor;
    if (extension->is_repeated != true) {
      FVar14 = '\t';
      goto LAB_003da0bf;
    }
    FVar14 = '\t';
LAB_003d9ffd:
    value_00 = AddString_abi_cxx11_(this,number,FVar14,pFVar13);
    goto LAB_003da0c4;
  case '\n':
    pMVar10 = (MessageLite *)(extension->field_5).enum_validity_check.func;
    if (extension->is_repeated == true) {
      pMVar10 = AddMessage(this,number,'\n',pMVar10,extension->descriptor);
    }
    else {
      pMVar10 = MutableMessage(this,number,'\n',pMVar10,extension->descriptor);
    }
    iVar8 = input->recursion_budget_;
    input->recursion_budget_ = iVar8 + -1;
    if (iVar8 < 1) {
      return false;
    }
    bVar19 = MessageLite::MergePartialFromCodedStream(pMVar10,input);
    if (!bVar19) {
      return false;
    }
    if (input->recursion_budget_ < input->recursion_limit_) {
      input->recursion_budget_ = input->recursion_budget_ + 1;
      if (input->last_tag_ != number * 8 + 4U) {
        return false;
      }
      return true;
    }
    __assert_fail("recursion_budget_ < recursion_limit_",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/io/coded_stream.h"
                  ,0x609,
                  "void google::protobuf::io::CodedInputStream::UnsafeDecrementRecursionDepth()");
  case '\v':
    pMVar10 = (MessageLite *)(extension->field_5).enum_validity_check.func;
    if (extension->is_repeated == true) {
      pMVar10 = AddMessage(this,number,'\v',pMVar10,extension->descriptor);
    }
    else {
      pMVar10 = MutableMessage(this,number,'\v',pMVar10,extension->descriptor);
    }
    puVar4 = input->buffer_;
    if ((puVar4 < input->buffer_end_) && (iVar8 = (int)(char)*puVar4, -1 < (char)*puVar4)) {
      input->buffer_ = puVar4 + 1;
      bVar19 = true;
    }
    else {
      iVar8 = io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
      bVar19 = -1 < iVar8;
    }
    if (!bVar19) {
      return false;
    }
    pVar11 = io::CodedInputStream::IncrementRecursionDepthAndPushLimit(input,iVar8);
    if ((long)pVar11 < 0) {
      return false;
    }
    bVar19 = MessageLite::MergePartialFromCodedStream(pMVar10,input);
    if (!bVar19) {
      return false;
    }
    bVar19 = io::CodedInputStream::DecrementRecursionDepthAndPopLimit(input,pVar11.first);
    break;
  case '\f':
    pFVar13 = extension->descriptor;
    if (extension->is_repeated == true) {
      FVar14 = '\f';
      goto LAB_003d9ffd;
    }
    FVar14 = '\f';
LAB_003da0bf:
    value_00 = MutableString_abi_cxx11_(this,number,FVar14,pFVar13);
LAB_003da0c4:
    bVar19 = WireFormatLite::ReadBytes(input,value_00);
    break;
  case '\r':
    pbVar3 = input->buffer_;
    if (pbVar3 < input->buffer_end_) {
      bVar1 = *pbVar3;
      uVar18 = (ulong)bVar1;
      uVar9 = (uint32_t)bVar1;
      if ((char)bVar1 < '\0') goto LAB_003daae9;
      input->buffer_ = pbVar3 + 1;
      bVar19 = true;
    }
    else {
      uVar9 = 0;
LAB_003daae9:
      uVar18 = io::CodedInputStream::ReadVarint32Fallback(input,uVar9);
      bVar19 = -1 < (long)uVar18;
    }
    if (!bVar19) {
      return false;
    }
    if (extension->is_repeated == true) {
      AddUInt32(this,number,'\r',extension->is_packed,(uint32_t)uVar18,extension->descriptor);
    }
    else {
      SetUInt32(this,number,'\r',(uint32_t)uVar18,extension->descriptor);
    }
    goto LAB_003dab3c;
  case '\x0e':
    pbVar3 = input->buffer_;
    if (pbVar3 < input->buffer_end_) {
      uVar15 = (uint)*pbVar3;
      if (-1 < (char)*pbVar3) {
        input->buffer_ = pbVar3 + 1;
        bVar19 = true;
        goto LAB_003dabaf;
      }
    }
    else {
      uVar15 = 0;
    }
    iVar12 = io::CodedInputStream::ReadVarint32Fallback(input,uVar15);
    uVar15 = (uint)iVar12;
    bVar19 = -1 < iVar12;
LAB_003dabaf:
    if (!bVar19) {
      return false;
    }
    bVar7 = (*(extension->field_5).enum_validity_check.func)
                      ((extension->field_5).enum_validity_check.arg,uVar15);
    if (bVar7) {
      if (extension->is_repeated == true) {
        AddEnum(this,number,'\x0e',extension->is_packed,uVar15,extension->descriptor);
      }
      else {
        SetEnum(this,number,'\x0e',uVar15,extension->descriptor);
      }
    }
    else {
      (*field_skipper->_vptr_FieldSkipper[4])(field_skipper,number,(ulong)uVar15);
    }
    if (bVar19) {
      return true;
    }
    return false;
  case '\x0f':
    puVar4 = input->buffer_;
    if (*(int *)&input->buffer_end_ - (int)puVar4 < 4) {
      bVar19 = io::CodedInputStream::ReadLittleEndian32Fallback(input,&local_78.level_);
    }
    else {
      local_78.level_ = *(undefined4 *)puVar4;
      input->buffer_ = puVar4 + 4;
      bVar19 = true;
    }
    if (bVar19 == false) {
      return false;
    }
    if (extension->is_repeated == true) {
      AddInt32(this,number,'\x0f',extension->is_packed,local_78.level_,extension->descriptor);
    }
    else {
      SetInt32(this,number,'\x0f',local_78.level_,extension->descriptor);
    }
    break;
  case '\x10':
    pdVar5 = (double *)input->buffer_;
    if (*(int *)&input->buffer_end_ - (int)pdVar5 < 8) {
      bVar19 = io::CodedInputStream::ReadLittleEndian64Fallback(input,(uint64_t *)&local_78);
    }
    else {
      local_78._0_8_ = *pdVar5;
      input->buffer_ = (uint8_t *)(pdVar5 + 1);
      bVar19 = true;
    }
    if (bVar19 == false) {
      return false;
    }
    if (extension->is_repeated == true) {
      AddInt64(this,number,'\x10',extension->is_packed,local_78._0_8_,extension->descriptor);
    }
    else {
      SetInt64(this,number,'\x10',local_78._0_8_,extension->descriptor);
    }
    break;
  case '\x11':
    pbVar3 = input->buffer_;
    if (pbVar3 < input->buffer_end_) {
      bVar1 = *pbVar3;
      uVar18 = (ulong)bVar1;
      uVar9 = (uint32_t)bVar1;
      if ((char)bVar1 < '\0') goto LAB_003daa1f;
      input->buffer_ = pbVar3 + 1;
      bVar19 = true;
    }
    else {
      uVar9 = 0;
LAB_003daa1f:
      uVar18 = io::CodedInputStream::ReadVarint32Fallback(input,uVar9);
      bVar19 = -1 < (long)uVar18;
    }
    if (!bVar19) {
      return false;
    }
    uVar15 = -((uint)uVar18 & 1) ^ (uint)(uVar18 >> 1) & 0x7fffffff;
    if (extension->is_repeated == true) {
      bVar7 = extension->is_packed;
      pFVar13 = extension->descriptor;
      FVar14 = '\x11';
      goto LAB_003daabf;
    }
    pFVar13 = extension->descriptor;
    FVar14 = '\x11';
LAB_003daad8:
    SetInt32(this,number,FVar14,uVar15,pFVar13);
LAB_003dab3c:
    if (!bVar19) {
      return false;
    }
    return true;
  case '\x12':
    puVar4 = input->buffer_;
    if ((puVar4 < input->buffer_end_) && (uVar18 = (ulong)(char)*puVar4, -1 < (long)uVar18)) {
      input->buffer_ = puVar4 + 1;
      uVar15 = 1;
    }
    else {
      pVar23 = io::CodedInputStream::ReadVarint64Fallback(input);
      uVar18 = pVar23.first;
      uVar15 = pVar23._8_4_;
    }
    if ((uVar15 & 1) == 0) {
      return false;
    }
    uVar18 = -(ulong)((uint)uVar18 & 1) ^ uVar18 >> 1;
    if (extension->is_repeated == true) {
      bVar19 = extension->is_packed;
      pFVar13 = extension->descriptor;
      FVar14 = '\x12';
      goto LAB_003da1db;
    }
    pFVar13 = extension->descriptor;
    FVar14 = '\x12';
LAB_003da2e6:
    SetInt64(this,number,FVar14,uVar18,pFVar13);
LAB_003da2ee:
    if ((uVar15 & 1) == 0) {
      return false;
    }
    return true;
  default:
    goto LAB_003dac16;
  }
  if (bVar19 == false) {
    return false;
  }
LAB_003dac16:
  return true;
}

Assistant:

bool ExtensionSet::ParseFieldWithExtensionInfo(int number,
                                               bool was_packed_on_wire,
                                               const ExtensionInfo& extension,
                                               io::CodedInputStream* input,
                                               FieldSkipper* field_skipper) {
  // Explicitly not read extension.is_packed, instead check whether the field
  // was encoded in packed form on the wire.
  if (was_packed_on_wire) {
    uint32_t size;
    if (!input->ReadVarint32(&size)) return false;
    io::CodedInputStream::Limit limit = input->PushLimit(size);

    switch (extension.type) {
#define HANDLE_TYPE(UPPERCASE, CPP_CAMELCASE, CPP_LOWERCASE)                \
  case WireFormatLite::TYPE_##UPPERCASE:                                    \
    while (input->BytesUntilLimit() > 0) {                                  \
      CPP_LOWERCASE value;                                                  \
      if (!WireFormatLite::ReadPrimitive<CPP_LOWERCASE,                     \
                                         WireFormatLite::TYPE_##UPPERCASE>( \
              input, &value))                                               \
        return false;                                                       \
      Add##CPP_CAMELCASE(number, WireFormatLite::TYPE_##UPPERCASE,          \
                         extension.is_packed, value, extension.descriptor); \
    }                                                                       \
    break

      HANDLE_TYPE(INT32, Int32, int32_t);
      HANDLE_TYPE(INT64, Int64, int64_t);
      HANDLE_TYPE(UINT32, UInt32, uint32_t);
      HANDLE_TYPE(UINT64, UInt64, uint64_t);
      HANDLE_TYPE(SINT32, Int32, int32_t);
      HANDLE_TYPE(SINT64, Int64, int64_t);
      HANDLE_TYPE(FIXED32, UInt32, uint32_t);
      HANDLE_TYPE(FIXED64, UInt64, uint64_t);
      HANDLE_TYPE(SFIXED32, Int32, int32_t);
      HANDLE_TYPE(SFIXED64, Int64, int64_t);
      HANDLE_TYPE(FLOAT, Float, float);
      HANDLE_TYPE(DOUBLE, Double, double);
      HANDLE_TYPE(BOOL, Bool, bool);
#undef HANDLE_TYPE

      case WireFormatLite::TYPE_ENUM:
        while (input->BytesUntilLimit() > 0) {
          int value;
          if (!WireFormatLite::ReadPrimitive<int, WireFormatLite::TYPE_ENUM>(
                  input, &value))
            return false;
          if (extension.enum_validity_check.func(
                  extension.enum_validity_check.arg, value)) {
            AddEnum(number, WireFormatLite::TYPE_ENUM, extension.is_packed,
                    value, extension.descriptor);
          } else {
            // Invalid value.  Treat as unknown.
            field_skipper->SkipUnknownEnum(number, value);
          }
        }
        break;

      case WireFormatLite::TYPE_STRING:
      case WireFormatLite::TYPE_BYTES:
      case WireFormatLite::TYPE_GROUP:
      case WireFormatLite::TYPE_MESSAGE:
        GOOGLE_LOG(FATAL) << "Non-primitive types can't be packed.";
        break;
    }

    input->PopLimit(limit);
  } else {
    switch (extension.type) {
#define HANDLE_TYPE(UPPERCASE, CPP_CAMELCASE, CPP_LOWERCASE)                \
  case WireFormatLite::TYPE_##UPPERCASE: {                                  \
    CPP_LOWERCASE value;                                                    \
    if (!WireFormatLite::ReadPrimitive<CPP_LOWERCASE,                       \
                                       WireFormatLite::TYPE_##UPPERCASE>(   \
            input, &value))                                                 \
      return false;                                                         \
    if (extension.is_repeated) {                                            \
      Add##CPP_CAMELCASE(number, WireFormatLite::TYPE_##UPPERCASE,          \
                         extension.is_packed, value, extension.descriptor); \
    } else {                                                                \
      Set##CPP_CAMELCASE(number, WireFormatLite::TYPE_##UPPERCASE, value,   \
                         extension.descriptor);                             \
    }                                                                       \
  } break

      HANDLE_TYPE(INT32, Int32, int32_t);
      HANDLE_TYPE(INT64, Int64, int64_t);
      HANDLE_TYPE(UINT32, UInt32, uint32_t);
      HANDLE_TYPE(UINT64, UInt64, uint64_t);
      HANDLE_TYPE(SINT32, Int32, int32_t);
      HANDLE_TYPE(SINT64, Int64, int64_t);
      HANDLE_TYPE(FIXED32, UInt32, uint32_t);
      HANDLE_TYPE(FIXED64, UInt64, uint64_t);
      HANDLE_TYPE(SFIXED32, Int32, int32_t);
      HANDLE_TYPE(SFIXED64, Int64, int64_t);
      HANDLE_TYPE(FLOAT, Float, float);
      HANDLE_TYPE(DOUBLE, Double, double);
      HANDLE_TYPE(BOOL, Bool, bool);
#undef HANDLE_TYPE

      case WireFormatLite::TYPE_ENUM: {
        int value;
        if (!WireFormatLite::ReadPrimitive<int, WireFormatLite::TYPE_ENUM>(
                input, &value))
          return false;

        if (!extension.enum_validity_check.func(
                extension.enum_validity_check.arg, value)) {
          // Invalid value.  Treat as unknown.
          field_skipper->SkipUnknownEnum(number, value);
        } else if (extension.is_repeated) {
          AddEnum(number, WireFormatLite::TYPE_ENUM, extension.is_packed, value,
                  extension.descriptor);
        } else {
          SetEnum(number, WireFormatLite::TYPE_ENUM, value,
                  extension.descriptor);
        }
        break;
      }

      case WireFormatLite::TYPE_STRING: {
        std::string* value =
            extension.is_repeated
                ? AddString(number, WireFormatLite::TYPE_STRING,
                            extension.descriptor)
                : MutableString(number, WireFormatLite::TYPE_STRING,
                                extension.descriptor);
        if (!WireFormatLite::ReadString(input, value)) return false;
        break;
      }

      case WireFormatLite::TYPE_BYTES: {
        std::string* value =
            extension.is_repeated
                ? AddString(number, WireFormatLite::TYPE_BYTES,
                            extension.descriptor)
                : MutableString(number, WireFormatLite::TYPE_BYTES,
                                extension.descriptor);
        if (!WireFormatLite::ReadBytes(input, value)) return false;
        break;
      }

      case WireFormatLite::TYPE_GROUP: {
        MessageLite* value =
            extension.is_repeated
                ? AddMessage(number, WireFormatLite::TYPE_GROUP,
                             *extension.message_info.prototype,
                             extension.descriptor)
                : MutableMessage(number, WireFormatLite::TYPE_GROUP,
                                 *extension.message_info.prototype,
                                 extension.descriptor);
        if (!WireFormatLite::ReadGroup(number, input, value)) return false;
        break;
      }

      case WireFormatLite::TYPE_MESSAGE: {
        MessageLite* value =
            extension.is_repeated
                ? AddMessage(number, WireFormatLite::TYPE_MESSAGE,
                             *extension.message_info.prototype,
                             extension.descriptor)
                : MutableMessage(number, WireFormatLite::TYPE_MESSAGE,
                                 *extension.message_info.prototype,
                                 extension.descriptor);
        if (!WireFormatLite::ReadMessage(input, value)) return false;
        break;
      }
    }
  }

  return true;
}